

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetTics(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  int iVar1;
  undefined8 *puVar2;
  void *pvVar3;
  PClass *pPVar4;
  PClass *pPVar5;
  DPSprite *pDVar6;
  int iVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  undefined8 *puVar9;
  char *pcVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar8 = CONCAT44(in_register_00000014,numparam);
  if (0 < numparam) {
    if ((param->field_0).field_3.Type != '\x03') {
LAB_003deafb:
      pcVar10 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003deb14;
    }
    puVar9 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar9 == (undefined8 *)0x0) goto LAB_003de9fc;
      auVar12._8_8_ = uVar8;
      auVar12._0_8_ = puVar9[1];
      if (puVar9[1] == 0) {
        auVar12 = (**(code **)*puVar9)(puVar9);
        puVar9[1] = auVar12._0_8_;
      }
      pPVar5 = auVar12._0_8_;
      bVar11 = pPVar5 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar8 = (ulong)bVar11;
      defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar5 == pPVar4 || bVar11);
      if (pPVar5 != pPVar4 && !bVar11) {
        do {
          pPVar5 = pPVar5->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
          if (pPVar5 == pPVar4) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003deb14;
      }
    }
    else {
      if (puVar9 != (undefined8 *)0x0) goto LAB_003deafb;
LAB_003de9fc:
      puVar9 = (undefined8 *)0x0;
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if (param[1].field_0.field_3.Type != '\x03') goto LAB_003deafb;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar5 = (PClass *)puVar2[1];
          if (pPVar5 == (PClass *)0x0) {
            pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,defaultparam,uVar8,ret);
            puVar2[1] = pPVar5;
          }
          bVar11 = pPVar5 != (PClass *)0x0;
          if (pPVar5 != pPVar4 && bVar11) {
            do {
              pPVar5 = pPVar5->ParentClass;
              bVar11 = pPVar5 != (PClass *)0x0;
              if (pPVar5 == pPVar4) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          if (!bVar11) {
            pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_003deb14;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_003deafb;
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar10 = "(paramnum) < numparam";
LAB_003deb3c:
            __assert_fail(pcVar10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1659,
                          "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (param[3].field_0.field_3.Type != '\0') {
            pcVar10 = "param[paramnum].Type == REGT_INT";
            goto LAB_003deb3c;
          }
          pvVar3 = param[2].field_0.field_1.a;
          iVar1 = param[3].field_0.i;
          if (pvVar3 == (void *)0x0 || (player_t *)puVar9[0x46] == (player_t *)0x0) {
            if (pvVar3 == (void *)0x0) goto LAB_003deaea;
            iVar7 = *(int *)((long)pvVar3 + 8);
          }
          else {
            iVar7 = *(int *)((long)pvVar3 + 8);
            if (iVar7 == 1) {
              pDVar6 = player_t::FindPSprite((player_t *)puVar9[0x46],*(int *)((long)pvVar3 + 0xc));
              if (pDVar6 == (DPSprite *)0x0) {
                return 0;
              }
              pDVar6->Tics = iVar1;
              return 0;
            }
          }
          if (iVar7 != 0) {
            return 0;
          }
LAB_003deaea:
          *(int *)(puVar9 + 0x33) = iVar1;
          return 0;
        }
        pcVar10 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003deb14;
      }
    }
  }
  pcVar10 = "(paramnum) < numparam";
LAB_003deb14:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1658,
                "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetTics)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(tics_to_set);

	if (ACTION_CALL_FROM_PSPRITE())
	{
		DPSprite *pspr = self->player->FindPSprite(stateinfo->mPSPIndex);
		if (pspr != nullptr)
		{
			pspr->Tics = tics_to_set;
			return 0;
		}
	}
	else if (ACTION_CALL_FROM_ACTOR())
	{
		// Just set tics for self.
		self->tics = tics_to_set;
	}
	// for inventory state chains this needs to be ignored.
	return 0;
}